

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O3

double __thiscall
Alg::opim_approx_fast
          (Alg *this,Graph *graph,double budget,vector<double,_std::allocator<double>_> *budget_list
          ,double epsilon,double feps,double delta,string *model,string *graphname,int mode)

{
  double dVar1;
  double dVar2;
  double dVar3;
  char cVar4;
  ostream *poVar5;
  long lVar6;
  long *plVar7;
  long lVar8;
  undefined8 uVar9;
  size_type *psVar10;
  long *plVar11;
  Graph *pGVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  double dVar18;
  double approxOPIMC;
  double infVldt;
  vector<double,_std::allocator<double>_> time_f;
  vector<double,_std::allocator<double>_> time_b;
  vector<double,_std::allocator<double>_> time_n;
  vector<double,_std::allocator<double>_> approx_f;
  vector<double,_std::allocator<double>_> approx_b;
  vector<double,_std::allocator<double>_> approx_n;
  vector<double,_std::allocator<double>_> inf_f;
  vector<double,_std::allocator<double>_> inf_b;
  vector<double,_std::allocator<double>_> inf_n;
  double timeb_f;
  double timeb_b;
  double timeb_n;
  time_t now;
  ofstream outfile;
  double local_508;
  long *local_4f0;
  long local_4e8;
  long local_4e0;
  long lStack_4d8;
  double local_4d0;
  double local_4c8;
  double local_4c0;
  double local_4b8;
  double local_4b0;
  undefined1 local_4a8 [16];
  double local_490;
  double local_488;
  HyperGraph *local_480;
  long *local_478;
  long local_470;
  long local_468;
  long lStack_460;
  long *local_458;
  long local_450;
  long local_448;
  long lStack_440;
  double local_438;
  double local_430;
  double local_428;
  Nodelist *local_420;
  double local_418;
  vector<double,_std::allocator<double>_> *local_410;
  vector<double,_std::allocator<double>_> local_408;
  vector<double,_std::allocator<double>_> local_3e8;
  vector<double,_std::allocator<double>_> local_3c8;
  double *local_3a8;
  iterator iStack_3a0;
  double *local_398;
  double *local_388;
  iterator iStack_380;
  double *local_378;
  double *local_368;
  iterator iStack_360;
  double *local_358;
  double *local_348;
  iterator iStack_340;
  double *local_338;
  double *local_328;
  iterator iStack_320;
  double *local_318;
  double *local_308;
  iterator iStack_300;
  double *local_2f8;
  string *local_2e8;
  double local_2e0;
  double local_2d8;
  double local_2d0;
  double local_2c8;
  double local_2c0;
  double local_2b8;
  string *local_2b0;
  HyperGraph *local_2a8;
  double local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  time_t local_238;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_418 = budget;
  local_410 = budget_list;
  local_2e8 = graphname;
  local_2b0 = model;
  std::chrono::_V2::system_clock::now();
  std::ofstream::ofstream(&local_230);
  local_488 = log(36.0 / delta);
  dVar3 = log(36.0 / delta);
  lVar14 = 0;
  local_2b8 = 0.0;
  local_2c0 = 0.0;
  local_2c8 = 0.0;
  local_2f8 = (double *)0x0;
  local_308 = (double *)0x0;
  iStack_300._M_current = (double *)0x0;
  local_318 = (double *)0x0;
  local_328 = (double *)0x0;
  iStack_320._M_current = (double *)0x0;
  local_338 = (double *)0x0;
  local_348 = (double *)0x0;
  iStack_340._M_current = (double *)0x0;
  local_358 = (double *)0x0;
  local_368 = (double *)0x0;
  iStack_360._M_current = (double *)0x0;
  local_378 = (double *)0x0;
  local_388 = (double *)0x0;
  iStack_380._M_current = (double *)0x0;
  local_398 = (double *)0x0;
  local_3a8 = (double *)0x0;
  iStack_3a0._M_current = (double *)0x0;
  local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_2a8 = &this->__hyperG;
  local_480 = &this->__hyperGVldt;
  local_428 = (local_488 + local_488) / 9.0;
  local_4b0 = local_488 * 0.5;
  local_488 = local_488 / 18.0;
  dVar3 = dVar3 * 0.5;
  local_430 = SQRT(local_4b0);
  local_438 = SQRT(dVar3);
  local_2e0 = 0.0;
  local_2d8 = 0.0;
  local_4c8 = 0.0;
  local_2d0 = 0.0;
  local_420 = &this->__vecSeed;
  do {
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    iVar13 = 1000 << ((byte)lVar14 & 0x1f);
    lVar6 = std::chrono::_V2::system_clock::now();
    HyperGraph::build_n_RRsets(local_2a8,(long)iVar13);
    HyperGraph::build_n_RRsets(local_480,(long)iVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# RR sets: ",0xb);
    plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar13);
    cVar4 = std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    pGVar12 = (Graph *)(ulong)(uint)(int)cVar4;
    std::ostream::put((char)plVar7);
    std::ostream::flush();
    this->__numRRsets = (this->__hyperG).__numRRsets;
    lVar8 = std::chrono::_V2::system_clock::now();
    local_490 = (double)(lVar8 - lVar6) / 1000000000.0;
    local_4d0 = max_cover_lazy_budget_fast_end
                          (this,pGVar12,local_418,local_410,0.01,&local_2b8,mode);
    lVar6 = std::chrono::_V2::system_clock::now();
    local_2a0 = (double)(lVar6 - lVar8) / 1000000000.0;
    local_458 = (long *)HyperGraph::self_inf_cal(local_480,local_420);
    dVar18 = (double)CONCAT44(0x45300000,(int)(this->__numRRsets >> 0x20)) - 1.9342813113834067e+25;
    if (mode == 1) {
      dVar1 = this->__boundLast_inf;
      uVar16 = SUB84(dVar1,0);
      uVar17 = (undefined4)((ulong)dVar1 >> 0x20);
      dVar2 = this->__boundLast_inf_cost;
      if (dVar1 <= dVar2) {
        uVar16 = SUB84(dVar2,0);
        uVar17 = (undefined4)((ulong)dVar2 >> 0x20);
      }
      local_508 = (double)CONCAT44(uVar17,uVar16);
    }
    else {
      local_508 = local_4d0;
      if (mode == 2) {
        if (this->__is_inf_cost == true) {
          uVar16 = SUB84(this->__boundMin_inf_cost,0);
          uVar17 = (undefined4)((ulong)this->__boundMin_inf_cost >> 0x20);
        }
        else {
          uVar16 = SUB84(this->__boundMin_inf,0);
          uVar17 = (undefined4)((ulong)this->__boundMin_inf >> 0x20);
        }
        local_508 = (double)CONCAT44(uVar17,uVar16);
      }
    }
    dVar2 = dVar18 + ((double)CONCAT44(0x43300000,(int)this->__numRRsets) - 4503599627370496.0);
    local_4c0 = (double)this->__numV;
    dVar1 = ((double)local_458 * dVar2) / local_4c0 + local_428;
    local_4a8._8_4_ = SUB84(dVar18,0);
    local_4a8._0_8_ = dVar2;
    local_4a8._12_4_ = (int)((ulong)dVar18 >> 0x20);
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
      dVar2 = (double)local_4a8._0_8_;
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    dVar18 = local_430;
    if (local_4b0 < 0.0) {
      dVar18 = sqrt(local_4b0);
      dVar2 = (double)local_4a8._0_8_;
    }
    dVar2 = (dVar2 * local_508) / local_4c0 + dVar3;
    local_4b8 = dVar18;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    uVar16 = SUB84(local_438,0);
    uVar17 = (undefined4)((ulong)local_438 >> 0x20);
    if (dVar3 < 0.0) {
      local_4a8._0_8_ = dVar2;
      dVar18 = sqrt(dVar3);
      uVar16 = SUB84(dVar18,0);
      uVar17 = (undefined4)((ulong)dVar18 >> 0x20);
      dVar2 = (double)local_4a8._0_8_;
    }
    dVar2 = dVar2 + (double)CONCAT44(uVar17,uVar16);
    dVar18 = (dVar1 - local_4b8) * (dVar1 - local_4b8) - local_488;
    dVar1 = 0.0;
    if (0.0 <= dVar18) {
      dVar1 = dVar18;
    }
    local_478 = (long *)(dVar1 / (dVar2 * dVar2));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," -->OPIM-APPROX-F-0.01 (",0x18);
    lVar14 = lVar14 + 1;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/",1);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,") approx. (max-cover): ",0x17);
    poVar5 = std::ostream::_M_insert<double>((double)local_478);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
    poVar5 = std::ostream::_M_insert<double>(local_4d0 / local_508);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"), #RR sets: ",0xd);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    local_4f0._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_4f0,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"==>Influence via R2: ",0x15);
    poVar5 = std::ostream::_M_insert<double>((double)local_458);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", time: ",8);
    poVar5 = std::ostream::_M_insert<double>(this->__tRes->__RunningTime);
    local_4f0._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_4f0,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"==>Time for RR sets and greedy: ",0x20);
    local_4c8 = local_4c8 + local_490;
    poVar5 = std::ostream::_M_insert<double>(local_4c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
    local_2d0 = local_2d0 + local_2a0;
    plVar7 = (long *)(local_4c8 + local_2d0);
    poVar5 = std::ostream::_M_insert<double>((double)plVar7);
    local_4f0._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_4f0,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"==>Time for Bound Computation: ",0x1f);
    poVar5 = std::ostream::_M_insert<double>(local_2b8);
    local_4f0 = (long *)CONCAT71(local_4f0._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_4f0,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Seed size: ",0xb);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if (iStack_360._M_current == local_358) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_368,iStack_360,(double *)&local_478
                );
    }
    else {
      *iStack_360._M_current = (double)local_478;
      iStack_360._M_current = iStack_360._M_current + 1;
    }
    if (iStack_300._M_current == local_2f8) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_308,iStack_300,(double *)&local_458
                );
    }
    else {
      *iStack_300._M_current = (double)local_458;
      iStack_300._M_current = iStack_300._M_current + 1;
    }
    local_4f0 = plVar7;
    if (local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      pGVar12 = (Graph *)local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish;
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_3c8,
                 (iterator)
                 local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(double *)&local_4f0);
    }
    else {
      *local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish = (double)plVar7;
      pGVar12 = (Graph *)(local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish + 1);
      local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)pGVar12;
    }
    lVar6 = std::chrono::_V2::system_clock::now();
    local_4d0 = max_cover_lazy_budget_fast_end
                          (this,pGVar12,local_418,local_410,0.05,&local_2c0,mode);
    lVar8 = std::chrono::_V2::system_clock::now();
    local_490 = (double)(lVar8 - lVar6) / 1000000000.0;
    local_458 = (long *)HyperGraph::self_inf_cal(local_480,local_420);
    dVar18 = (double)CONCAT44(0x45300000,(int)(this->__numRRsets >> 0x20)) - 1.9342813113834067e+25;
    if (mode == 1) {
      dVar1 = this->__boundLast_inf;
      uVar16 = SUB84(dVar1,0);
      uVar17 = (undefined4)((ulong)dVar1 >> 0x20);
      dVar2 = this->__boundLast_inf_cost;
      if (dVar1 <= dVar2) {
        uVar16 = SUB84(dVar2,0);
        uVar17 = (undefined4)((ulong)dVar2 >> 0x20);
      }
LAB_00111225:
      local_508 = (double)CONCAT44(uVar17,uVar16);
    }
    else {
      local_508 = local_4d0;
      if (mode == 2) {
        if (this->__is_inf_cost == true) {
          uVar16 = SUB84(this->__boundMin_inf_cost,0);
          uVar17 = (undefined4)((ulong)this->__boundMin_inf_cost >> 0x20);
        }
        else {
          uVar16 = SUB84(this->__boundMin_inf,0);
          uVar17 = (undefined4)((ulong)this->__boundMin_inf >> 0x20);
        }
        goto LAB_00111225;
      }
    }
    dVar1 = dVar18 + ((double)CONCAT44(0x43300000,(int)this->__numRRsets) - 4503599627370496.0);
    local_4a8._8_4_ = SUB84(dVar18,0);
    local_4a8._0_8_ = dVar1;
    local_4a8._12_4_ = (int)((ulong)dVar18 >> 0x20);
    local_4c0 = (double)this->__numV;
    dVar18 = ((double)local_458 * dVar1) / local_4c0 + local_428;
    if (dVar18 < 0.0) {
      dVar18 = sqrt(dVar18);
    }
    else {
      dVar18 = SQRT(dVar18);
    }
    uVar16 = SUB84(local_430,0);
    uVar17 = (undefined4)((ulong)local_430 >> 0x20);
    if (local_4b0 < 0.0) {
      dVar1 = sqrt(local_4b0);
      uVar16 = SUB84(dVar1,0);
      uVar17 = (undefined4)((ulong)dVar1 >> 0x20);
    }
    local_4b8 = (double)CONCAT44(uVar17,uVar16);
    dVar1 = ((double)local_4a8._0_8_ * local_508) / local_4c0 + dVar3;
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    uVar16 = SUB84(local_438,0);
    uVar17 = (undefined4)((ulong)local_438 >> 0x20);
    if (dVar3 < 0.0) {
      local_4a8._0_8_ = dVar1;
      dVar1 = sqrt(dVar3);
      uVar16 = SUB84(dVar1,0);
      uVar17 = (undefined4)((ulong)dVar1 >> 0x20);
      dVar1 = (double)local_4a8._0_8_;
    }
    dVar1 = dVar1 + (double)CONCAT44(uVar17,uVar16);
    dVar18 = (dVar18 - local_4b8) * (dVar18 - local_4b8) - local_488;
    dVar2 = 0.0;
    if (0.0 <= dVar18) {
      dVar2 = dVar18;
    }
    local_478 = (long *)(dVar2 / (dVar1 * dVar1));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," -->OPIM-APPROX-F-0.05 (",0x18);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/",1);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,") approx. (max-cover): ",0x17);
    poVar5 = std::ostream::_M_insert<double>((double)local_478);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
    poVar5 = std::ostream::_M_insert<double>(local_4d0 / local_508);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"), #RR sets: ",0xd);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    local_4f0._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_4f0,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"==>Influence via R2: ",0x15);
    poVar5 = std::ostream::_M_insert<double>((double)local_458);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", time: ",8);
    poVar5 = std::ostream::_M_insert<double>(this->__tRes->__RunningTime);
    local_4f0._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_4f0,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"==>Time for RR sets and greedy: ",0x20);
    poVar5 = std::ostream::_M_insert<double>(local_4c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
    local_2d8 = local_2d8 + local_490;
    plVar7 = (long *)(local_4c8 + local_2d8);
    poVar5 = std::ostream::_M_insert<double>((double)plVar7);
    local_4f0._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_4f0,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"==>Time for Bound Computation: ",0x1f);
    poVar5 = std::ostream::_M_insert<double>(local_2c0);
    local_4f0 = (long *)CONCAT71(local_4f0._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_4f0,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Seed size: ",0xb);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if (iStack_380._M_current == local_378) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_388,iStack_380,(double *)&local_478
                );
    }
    else {
      *iStack_380._M_current = (double)local_478;
      iStack_380._M_current = iStack_380._M_current + 1;
    }
    if (iStack_320._M_current == local_318) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_328,iStack_320,(double *)&local_458
                );
    }
    else {
      *iStack_320._M_current = (double)local_458;
      iStack_320._M_current = iStack_320._M_current + 1;
    }
    local_4f0 = plVar7;
    if (local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      pGVar12 = (Graph *)local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish;
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_3e8,
                 (iterator)
                 local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(double *)&local_4f0);
    }
    else {
      *local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish = (double)plVar7;
      pGVar12 = (Graph *)(local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish + 1);
      local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)pGVar12;
    }
    lVar6 = std::chrono::_V2::system_clock::now();
    local_4d0 = max_cover_lazy_budget_fast_end(this,pGVar12,local_418,local_410,0.1,&local_2c8,mode)
    ;
    lVar8 = std::chrono::_V2::system_clock::now();
    local_490 = (double)(lVar8 - lVar6) / 1000000000.0;
    local_458 = (long *)HyperGraph::self_inf_cal(local_480,local_420);
    dVar18 = (double)CONCAT44(0x45300000,(int)(this->__numRRsets >> 0x20)) - 1.9342813113834067e+25;
    if (mode == 1) {
      dVar1 = this->__boundLast_inf;
      uVar16 = SUB84(dVar1,0);
      uVar17 = (undefined4)((ulong)dVar1 >> 0x20);
      dVar2 = this->__boundLast_inf_cost;
      if (dVar1 <= dVar2) {
        uVar16 = SUB84(dVar2,0);
        uVar17 = (undefined4)((ulong)dVar2 >> 0x20);
      }
LAB_00111710:
      local_508 = (double)CONCAT44(uVar17,uVar16);
    }
    else {
      local_508 = local_4d0;
      if (mode == 2) {
        if (this->__is_inf_cost == true) {
          uVar16 = SUB84(this->__boundMin_inf_cost,0);
          uVar17 = (undefined4)((ulong)this->__boundMin_inf_cost >> 0x20);
        }
        else {
          uVar16 = SUB84(this->__boundMin_inf,0);
          uVar17 = (undefined4)((ulong)this->__boundMin_inf >> 0x20);
        }
        goto LAB_00111710;
      }
    }
    dVar1 = dVar18 + ((double)CONCAT44(0x43300000,(int)this->__numRRsets) - 4503599627370496.0);
    local_4a8._8_4_ = SUB84(dVar18,0);
    local_4a8._0_8_ = dVar1;
    local_4a8._12_4_ = (int)((ulong)dVar18 >> 0x20);
    local_4c0 = (double)this->__numV;
    dVar18 = ((double)local_458 * dVar1) / local_4c0 + local_428;
    if (dVar18 < 0.0) {
      dVar18 = sqrt(dVar18);
    }
    else {
      dVar18 = SQRT(dVar18);
    }
    uVar16 = SUB84(local_430,0);
    uVar17 = (undefined4)((ulong)local_430 >> 0x20);
    if (local_4b0 < 0.0) {
      dVar1 = sqrt(local_4b0);
      uVar16 = SUB84(dVar1,0);
      uVar17 = (undefined4)((ulong)dVar1 >> 0x20);
    }
    local_4b8 = (double)CONCAT44(uVar17,uVar16);
    dVar1 = ((double)local_4a8._0_8_ * local_508) / local_4c0 + dVar3;
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    uVar16 = SUB84(local_438,0);
    uVar17 = (undefined4)((ulong)local_438 >> 0x20);
    if (dVar3 < 0.0) {
      local_4a8._0_8_ = dVar1;
      dVar1 = sqrt(dVar3);
      uVar16 = SUB84(dVar1,0);
      uVar17 = (undefined4)((ulong)dVar1 >> 0x20);
      dVar1 = (double)local_4a8._0_8_;
    }
    dVar1 = dVar1 + (double)CONCAT44(uVar17,uVar16);
    dVar18 = (dVar18 - local_4b8) * (dVar18 - local_4b8) - local_488;
    dVar2 = 0.0;
    if (0.0 <= dVar18) {
      dVar2 = dVar18;
    }
    local_478 = (long *)(dVar2 / (dVar1 * dVar1));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," -->OPIM-APPROX-F-0.1 (",0x17);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/",1);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,") approx. (max-cover): ",0x17);
    poVar5 = std::ostream::_M_insert<double>((double)local_478);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
    poVar5 = std::ostream::_M_insert<double>(local_4d0 / local_508);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"), #RR sets: ",0xd);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    local_4f0._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_4f0,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"==>Influence via R2: ",0x15);
    poVar5 = std::ostream::_M_insert<double>((double)local_458);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", time: ",8);
    poVar5 = std::ostream::_M_insert<double>(this->__tRes->__RunningTime);
    local_4f0._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_4f0,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"==>Time for RR sets and greedy: ",0x20);
    poVar5 = std::ostream::_M_insert<double>(local_4c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
    local_2e0 = local_2e0 + local_490;
    plVar7 = (long *)(local_4c8 + local_2e0);
    poVar5 = std::ostream::_M_insert<double>((double)plVar7);
    local_4f0._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_4f0,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"==>Time for Bound Computation: ",0x1f);
    poVar5 = std::ostream::_M_insert<double>(local_2c8);
    local_4f0 = (long *)CONCAT71(local_4f0._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_4f0,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Seed size: ",0xb);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if (iStack_3a0._M_current == local_398) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_3a8,iStack_3a0,(double *)&local_478
                );
    }
    else {
      *iStack_3a0._M_current = (double)local_478;
      iStack_3a0._M_current = iStack_3a0._M_current + 1;
    }
    if (iStack_340._M_current == local_338) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_348,iStack_340,(double *)&local_458
                );
    }
    else {
      *iStack_340._M_current = (double)local_458;
      iStack_340._M_current = iStack_340._M_current + 1;
    }
    local_4f0 = plVar7;
    if (local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_408,
                 (iterator)
                 local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(double *)&local_4f0);
    }
    else {
      *local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish = (double)plVar7;
      local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    if (lVar14 == 0xc) {
      local_238 = time((time_t *)0x0);
      ctime(&local_238);
      std::operator+(&local_278,"xi/",local_2b0);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_278);
      local_298._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_298._M_dataplus._M_p == psVar10) {
        local_298.field_2._M_allocated_capacity = *psVar10;
        local_298.field_2._8_8_ = plVar7[3];
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      }
      else {
        local_298.field_2._M_allocated_capacity = *psVar10;
      }
      local_298._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::operator+(&local_258,&local_298,local_2e8);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_258);
      local_4f0 = (long *)*plVar7;
      plVar11 = plVar7 + 2;
      if (local_4f0 == plVar11) {
        local_4e0 = *plVar11;
        lStack_4d8 = plVar7[3];
        local_4f0 = &local_4e0;
      }
      else {
        local_4e0 = *plVar11;
      }
      local_4e8 = plVar7[1];
      *plVar7 = (long)plVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_4f0);
      local_478 = (long *)*plVar7;
      plVar11 = plVar7 + 2;
      if (local_478 == plVar11) {
        local_468 = *plVar11;
        lStack_460 = plVar7[3];
        local_478 = &local_468;
      }
      else {
        local_468 = *plVar11;
      }
      local_470 = plVar7[1];
      *plVar7 = (long)plVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_478);
      local_458 = (long *)*plVar7;
      plVar11 = plVar7 + 2;
      if (local_458 == plVar11) {
        local_448 = *plVar11;
        lStack_440 = plVar7[3];
        local_458 = &local_448;
      }
      else {
        local_448 = *plVar11;
      }
      local_450 = plVar7[1];
      *plVar7 = (long)plVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_458);
      if (local_458 != &local_448) {
        operator_delete(local_458,local_448 + 1);
      }
      if (local_478 != &local_468) {
        operator_delete(local_478,local_468 + 1);
      }
      if (local_4f0 != &local_4e0) {
        operator_delete(local_4f0,local_4e0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if (iStack_360._M_current != local_368) {
        uVar15 = 0;
        do {
          poVar5 = std::ostream::_M_insert<double>(local_368[uVar15]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
          uVar15 = uVar15 + 1;
        } while (uVar15 < (ulong)((long)iStack_360._M_current - (long)local_368 >> 3));
      }
      std::endl<char,std::char_traits<char>>((ostream *)&local_230);
      if (local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar15 = 0;
        do {
          poVar5 = std::ostream::_M_insert<double>
                             ((double)(&(((_Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                                           *)local_3c8.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start)->_M_impl).
                                        super__Vector_impl_data._M_start)[uVar15]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
          uVar15 = uVar15 + 1;
        } while (uVar15 < (ulong)((long)local_3c8.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                  (long)local_3c8.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start >> 3));
      }
      std::endl<char,std::char_traits<char>>((ostream *)&local_230);
      if (iStack_300._M_current != local_308) {
        uVar15 = 0;
        do {
          poVar5 = std::ostream::_M_insert<double>(local_308[uVar15]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
          uVar15 = uVar15 + 1;
        } while (uVar15 < (ulong)((long)iStack_300._M_current - (long)local_308 >> 3));
      }
      std::endl<char,std::char_traits<char>>((ostream *)&local_230);
      if (iStack_380._M_current != local_388) {
        uVar15 = 0;
        do {
          poVar5 = std::ostream::_M_insert<double>(local_388[uVar15]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
          uVar15 = uVar15 + 1;
        } while (uVar15 < (ulong)((long)iStack_380._M_current - (long)local_388 >> 3));
      }
      std::endl<char,std::char_traits<char>>((ostream *)&local_230);
      if (local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar15 = 0;
        do {
          poVar5 = std::ostream::_M_insert<double>
                             ((double)(&(((_Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                                           *)local_3e8.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start)->_M_impl).
                                        super__Vector_impl_data._M_start)[uVar15]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
          uVar15 = uVar15 + 1;
        } while (uVar15 < (ulong)((long)local_3e8.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                  (long)local_3e8.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start >> 3));
      }
      std::endl<char,std::char_traits<char>>((ostream *)&local_230);
      if (iStack_320._M_current != local_328) {
        uVar15 = 0;
        do {
          poVar5 = std::ostream::_M_insert<double>(local_328[uVar15]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
          uVar15 = uVar15 + 1;
        } while (uVar15 < (ulong)((long)iStack_320._M_current - (long)local_328 >> 3));
      }
      std::endl<char,std::char_traits<char>>((ostream *)&local_230);
      if (iStack_3a0._M_current != local_3a8) {
        uVar15 = 0;
        do {
          poVar5 = std::ostream::_M_insert<double>(local_3a8[uVar15]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
          uVar15 = uVar15 + 1;
        } while (uVar15 < (ulong)((long)iStack_3a0._M_current - (long)local_3a8 >> 3));
      }
      std::endl<char,std::char_traits<char>>((ostream *)&local_230);
      if (local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar15 = 0;
        do {
          poVar5 = std::ostream::_M_insert<double>
                             (local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar15]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
          uVar15 = uVar15 + 1;
        } while (uVar15 < (ulong)((long)local_408.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                  (long)local_408.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start >> 3));
      }
      std::endl<char,std::char_traits<char>>((ostream *)&local_230);
      if (iStack_340._M_current != local_348) {
        uVar15 = 0;
        do {
          poVar5 = std::ostream::_M_insert<double>(local_348[uVar15]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
          uVar15 = uVar15 + 1;
        } while (uVar15 < (ulong)((long)iStack_340._M_current - (long)local_348 >> 3));
      }
      std::endl<char,std::char_traits<char>>((ostream *)&local_230);
      uVar9 = std::ofstream::close();
      if (local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((Graph *)local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start != (Graph *)0x0) {
        operator_delete(local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((Graph *)local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start != (Graph *)0x0) {
        operator_delete(local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_3a8 != (double *)0x0) {
        operator_delete(local_3a8,(long)local_398 - (long)local_3a8);
      }
      if (local_388 != (double *)0x0) {
        operator_delete(local_388,(long)local_378 - (long)local_388);
      }
      if (local_368 != (double *)0x0) {
        operator_delete(local_368,(long)local_358 - (long)local_368);
      }
      if (local_348 != (double *)0x0) {
        operator_delete(local_348,(long)local_338 - (long)local_348);
      }
      if (local_328 != (double *)0x0) {
        operator_delete(local_328,(long)local_318 - (long)local_328);
      }
      if (local_308 != (double *)0x0) {
        operator_delete(local_308,(long)local_2f8 - (long)local_308);
      }
      local_230 = _VTT;
      *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
      std::filebuf::~filebuf(local_228);
      std::ios_base::~ios_base(local_138);
      _Unwind_Resume(uVar9);
    }
  } while( true );
}

Assistant:

double Alg::opim_approx_fast(const Graph & graph, const double budget, const std::vector<double> & budget_list,
        const double epsilon, const double feps, const double delta, const std::string model,
        const std::string graphname, const int mode) {
    Timer timerOPIMC("OPIM-APPORX");
    std::ofstream outfile;
    const auto numIter = 12;
    const auto theta_0 = 1000;
    const double a1 = log(numIter * 3.0 / delta);
    const double a2 = log(numIter * 3.0 / delta);
    double time1_n = 0.0, time2_n = 0.0;
    double timeb_n = 0.0;
    double time1_b = 0.0, time2_b = 0.0;
    double timeb_b = 0.0;
    double time1_f = 0.0, time2_f = 0.0;
    double timeb_f = 0.0;
    double time1_fs = 0.0, time2_fs = 0.0;
    double timeb_fs = 0.0;
    double time1_ft = 0.0, time2_ft = 0.0;
    double timeb_ft = 0.0;
    double time_rr = 0.0;
    std::vector<double> inf_n, inf_b, inf_f;
    std::vector<double> approx_n, approx_b, approx_f;
    std::vector<double> time_n, time_b, time_f;
    size_t idx = 0;
    while (true) {
        std::cout << idx << std::endl;
        const auto numR = theta_0 << idx;
        timerOPIMC.get_operation_time();
        __hyperG.build_n_RRsets(numR); // R1
        __hyperGVldt.build_n_RRsets(numR); // R2
        std::cout << "# RR sets: " << numR << std::endl;
        __numRRsets = __hyperG.get_RR_sets_size();
        /// OPIM-B-F 0.01
        time_rr += timerOPIMC.get_operation_time();
        auto infSelf = max_cover_budget_fast_end(graph, budget, budget_list, 0.01, timeb_n, mode);
        time2_n += timerOPIMC.get_operation_time();
        auto infVldt = __hyperGVldt.self_inf_cal(__vecSeed);
        auto degVldt = infVldt * __numRRsets / __numV;
        auto upperBound = infSelf;
        if (mode == 1) {
            upperBound = max_element(__boundLast_inf, __boundLast_inf_cost);
        }
        else if (mode == 2) {
            if (__is_inf_cost) {
                upperBound = __boundMin_inf_cost;
            }
            else {
                upperBound = __boundMin_inf;
            }
        }
        auto upperDegOPT = upperBound * __numRRsets / __numV;
        auto lowerSelect = pow2(sqrt(degVldt + a1 * 2.0 / 9.0) - sqrt(a1 / 2.0)) - a1 / 18.0;
        if (lowerSelect < 0) {
            lowerSelect = 0;
        }
        auto upperOPT = pow2(sqrt(upperDegOPT + a2 / 2.0) + sqrt(a2 / 2.0));
        auto approxOPIMC = lowerSelect / upperOPT;
        std::cout << " -->OPIM-APPROX-F-0.01 (" << idx + 1 << "/" << numIter << ") approx. (max-cover): " <<
                  approxOPIMC << " (" << infSelf / upperBound << "), #RR sets: " << __numRRsets << '\n';
        std::cout << "==>Influence via R2: " << infVldt << ", time: " << __tRes.get_running_time() << '\n';
        std::cout << "==>Time for RR sets and greedy: " << time_rr << ", " << time2_n + time_rr << '\n';
        std::cout << "==>Time for Bound Computation: " << timeb_n << '\n';
        std::cout << "Seed size: " << __vecSeed.size() << std::endl;
        approx_n.push_back(approxOPIMC);
        inf_n.push_back(infVldt);
        time_n.push_back(time2_n + time_rr);

        /// OPIM-B-F 0.05
        time1_b += timerOPIMC.get_operation_time();
        infSelf = max_cover_budget_fast_end(graph, budget, budget_list, 0.05, timeb_b, mode);
        time2_b += timerOPIMC.get_operation_time();
        infVldt = __hyperGVldt.self_inf_cal(__vecSeed);
        degVldt = infVldt * __numRRsets / __numV;
        upperBound = infSelf;
        if (mode == 1) {
            upperBound = max_element(__boundLast_inf, __boundLast_inf_cost);
        }
        else if (mode == 2) {
            if (__is_inf_cost) {
                upperBound = __boundMin_inf_cost;
            }
            else {
                upperBound = __boundMin_inf;
            }
        }
        upperDegOPT = upperBound * __numRRsets / __numV;
        lowerSelect = pow2(sqrt(degVldt + a1 * 2.0 / 9.0) - sqrt(a1 / 2.0)) - a1 / 18.0;
        if (lowerSelect < 0) {
            lowerSelect = 0;
        }
        upperOPT = pow2(sqrt(upperDegOPT + a2 / 2.0) + sqrt(a2 / 2.0));
        approxOPIMC = lowerSelect / upperOPT;
        std::cout << " -->OPIM-APPROX-F-0.05 (" << idx + 1 << "/" << numIter << ") approx. (max-cover): " <<
                  approxOPIMC << " (" << infSelf / upperBound << "), #RR sets: " << __numRRsets << '\n';
        std::cout << "==>Influence via R2: " << infVldt << ", time: " << __tRes.get_running_time() << '\n';
        std::cout << "==>Time for RR sets and greedy: " << time_rr << ", " << time2_b + time_rr << '\n';
        std::cout << "==>Time for Bound Computation: " << timeb_b << '\n';
        std::cout << "Seed size: " << __vecSeed.size() << std::endl;
        approx_b.push_back(approxOPIMC);
        inf_b.push_back(infVldt);
        time_b.push_back(time2_b + time_rr);

        /// OPIM-B-F 0.1
        time1_f += timerOPIMC.get_operation_time();
        infSelf = max_cover_budget_fast_end(graph, budget, budget_list, 0.1, timeb_f, mode);
        time2_f += timerOPIMC.get_operation_time();
        infVldt = __hyperGVldt.self_inf_cal(__vecSeed);
        degVldt = infVldt * __numRRsets / __numV;
        upperBound = infSelf;
        if (mode == 1) {
            upperBound = max_element(__boundLast_inf, __boundLast_inf_cost);
        }
        else if (mode == 2) {
            if (__is_inf_cost) {
                upperBound = __boundMin_inf_cost;
            }
            else {
                upperBound = __boundMin_inf;
            }
        }
        upperDegOPT = upperBound * __numRRsets / __numV;
        lowerSelect = pow2(sqrt(degVldt + a1 * 2.0 / 9.0) - sqrt(a1 / 2.0)) - a1 / 18.0;
        if (lowerSelect < 0) {
            lowerSelect = 0;
        }
        upperOPT = pow2(sqrt(upperDegOPT + a2 / 2.0) + sqrt(a2 / 2.0));
        approxOPIMC = lowerSelect / upperOPT;
        std::cout << " -->OPIM-APPROX-F-0.1 (" << idx + 1 << "/" << numIter << ") approx. (max-cover): " <<
                  approxOPIMC << " (" << infSelf / upperBound << "), #RR sets: " << __numRRsets << '\n';
        std::cout << "==>Influence via R2: " << infVldt << ", time: " << __tRes.get_running_time() << '\n';
        std::cout << "==>Time for RR sets and greedy: " << time_rr << ", " << time2_f + time_rr << '\n';
        std::cout << "==>Time for Bound Computation: " << timeb_f << '\n';
        std::cout << "Seed size: " << __vecSeed.size() << std::endl;
        approx_f.push_back(approxOPIMC);
        inf_f.push_back(infVldt);
        time_f.push_back(time2_f + time_rr);
        idx = idx + 1;
        if (idx == numIter) {
            break;
        }
    }
    time_t now = time(0);
    char* dt = ctime(&now);
    outfile.open("xi/" + model + "_" + graphname + "_" + dt + ".txt");
    for(int i = 0; i < approx_n.size(); i++) {
        outfile << approx_n[i] << ",";
    }
    outfile << std::endl;
    for(int i = 0; i < time_n.size(); i++) {
        outfile << time_n[i] << ",";
    }
    outfile << std::endl;
    for(int i = 0; i < inf_n.size(); i++) {
        outfile << inf_n[i] << ",";
    }
    outfile << std::endl;
    for(int i = 0; i < approx_b.size(); i++) {
        outfile << approx_b[i] << ",";
    }
    outfile << std::endl;
    for(int i = 0; i < time_b.size(); i++) {
        outfile << time_b[i] << ",";
    }
    outfile << std::endl;
    for(int i = 0; i < inf_b.size(); i++) {
        outfile << inf_b[i] << ",";
    }
    outfile << std::endl;
    for(int i = 0; i < approx_f.size(); i++) {
        outfile << approx_f[i] << ",";
    }
    outfile << std::endl;
    for(int i = 0; i < time_f.size(); i++) {
        outfile << time_f[i] << ",";
    }
    outfile << std::endl;
    for(int i = 0; i < inf_f.size(); i++) {
        outfile << inf_f[i] << ",";
    }
    outfile << std::endl;
    outfile.close();
}